

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_fastcgi_module.c
# Opt level: O1

ngx_int_t ngx_http_fastcgi_process_record(ngx_http_request_t *r,ngx_http_fastcgi_ctx_t *f)

{
  byte bVar1;
  char *fmt;
  ngx_log_t *pnVar2;
  ngx_http_fastcgi_state_e nVar3;
  byte *pbVar4;
  uint uVar5;
  ulong uVar6;
  
  nVar3 = f->state;
  pbVar4 = f->pos;
  if (pbVar4 < f->last) {
    do {
      bVar1 = *pbVar4;
      uVar6 = (ulong)bVar1;
      pnVar2 = r->connection->log;
      uVar5 = (uint)bVar1;
      if ((pnVar2->log_level & 0x100) != 0) {
        ngx_log_error_core(8,pnVar2,0,"http fastcgi record byte: %02Xd",uVar6);
      }
      switch(nVar3) {
      case ngx_http_fastcgi_st_version:
        nVar3 = ngx_http_fastcgi_st_type;
        if (uVar5 != 1) {
          pnVar2 = r->connection->log;
          if (pnVar2->log_level < 4) {
            return -1;
          }
          fmt = "upstream sent unsupported FastCGI protocol version: %d";
LAB_00175c66:
          ngx_log_error_core(4,pnVar2,0,fmt,uVar6);
          return -1;
        }
        break;
      case ngx_http_fastcgi_st_type:
        if ((7 < bVar1) || ((200U >> (uVar5 & 0x1f) & 1) == 0)) {
          pnVar2 = r->connection->log;
          if (pnVar2->log_level < 4) {
            return -1;
          }
          fmt = "upstream sent invalid FastCGI record type: %d";
          goto LAB_00175c66;
        }
        f->type = uVar6;
        nVar3 = ngx_http_fastcgi_st_request_id_hi;
        break;
      case ngx_http_fastcgi_st_request_id_hi:
        nVar3 = ngx_http_fastcgi_st_request_id_lo;
        if (uVar6 != 0) {
          pnVar2 = r->connection->log;
          if (pnVar2->log_level < 4) {
            return -1;
          }
          fmt = "upstream sent unexpected FastCGI request id high byte: %d";
          goto LAB_00175c66;
        }
        break;
      case ngx_http_fastcgi_st_request_id_lo:
        nVar3 = ngx_http_fastcgi_st_content_length_hi;
        if (uVar5 != 1) {
          pnVar2 = r->connection->log;
          if (pnVar2->log_level < 4) {
            return -1;
          }
          fmt = "upstream sent unexpected FastCGI request id low byte: %d";
          goto LAB_00175c66;
        }
        break;
      case ngx_http_fastcgi_st_content_length_hi:
        f->length = (ulong)bVar1 << 8;
        nVar3 = ngx_http_fastcgi_st_content_length_lo;
        break;
      case ngx_http_fastcgi_st_content_length_lo:
        f->length = f->length | uVar6;
        nVar3 = ngx_http_fastcgi_st_padding_length;
        break;
      case ngx_http_fastcgi_st_padding_length:
        f->padding = uVar6;
        nVar3 = ngx_http_fastcgi_st_reserved;
        break;
      case ngx_http_fastcgi_st_reserved:
        pnVar2 = r->connection->log;
        if ((pnVar2->log_level & 0x100) != 0) {
          ngx_log_error_core(8,pnVar2,0,"http fastcgi record length: %z",f->length);
        }
        f->pos = pbVar4 + 1;
        f->state = ngx_http_fastcgi_st_data;
        return 0;
      }
      pbVar4 = pbVar4 + 1;
    } while (pbVar4 < f->last);
  }
  f->state = nVar3;
  return -2;
}

Assistant:

static ngx_int_t
ngx_http_fastcgi_process_record(ngx_http_request_t *r,
    ngx_http_fastcgi_ctx_t *f)
{
    u_char                     ch, *p;
    ngx_http_fastcgi_state_e   state;

    state = f->state;

    for (p = f->pos; p < f->last; p++) {

        ch = *p;

        ngx_log_debug1(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                       "http fastcgi record byte: %02Xd", ch);

        switch (state) {

        case ngx_http_fastcgi_st_version:
            if (ch != 1) {
                ngx_log_error(NGX_LOG_ERR, r->connection->log, 0,
                              "upstream sent unsupported FastCGI "
                              "protocol version: %d", ch);
                return NGX_ERROR;
            }
            state = ngx_http_fastcgi_st_type;
            break;

        case ngx_http_fastcgi_st_type:
            switch (ch) {
            case NGX_HTTP_FASTCGI_STDOUT:
            case NGX_HTTP_FASTCGI_STDERR:
            case NGX_HTTP_FASTCGI_END_REQUEST:
                f->type = (ngx_uint_t) ch;
                break;
            default:
                ngx_log_error(NGX_LOG_ERR, r->connection->log, 0,
                              "upstream sent invalid FastCGI "
                              "record type: %d", ch);
                return NGX_ERROR;

            }
            state = ngx_http_fastcgi_st_request_id_hi;
            break;

        /* we support the single request per connection */

        case ngx_http_fastcgi_st_request_id_hi:
            if (ch != 0) {
                ngx_log_error(NGX_LOG_ERR, r->connection->log, 0,
                              "upstream sent unexpected FastCGI "
                              "request id high byte: %d", ch);
                return NGX_ERROR;
            }
            state = ngx_http_fastcgi_st_request_id_lo;
            break;

        case ngx_http_fastcgi_st_request_id_lo:
            if (ch != 1) {
                ngx_log_error(NGX_LOG_ERR, r->connection->log, 0,
                              "upstream sent unexpected FastCGI "
                              "request id low byte: %d", ch);
                return NGX_ERROR;
            }
            state = ngx_http_fastcgi_st_content_length_hi;
            break;

        case ngx_http_fastcgi_st_content_length_hi:
            f->length = ch << 8;
            state = ngx_http_fastcgi_st_content_length_lo;
            break;

        case ngx_http_fastcgi_st_content_length_lo:
            f->length |= (size_t) ch;
            state = ngx_http_fastcgi_st_padding_length;
            break;

        case ngx_http_fastcgi_st_padding_length:
            f->padding = (size_t) ch;
            state = ngx_http_fastcgi_st_reserved;
            break;

        case ngx_http_fastcgi_st_reserved:
            state = ngx_http_fastcgi_st_data;

            ngx_log_debug1(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                           "http fastcgi record length: %z", f->length);

            f->pos = p + 1;
            f->state = state;

            return NGX_OK;

        /* suppress warning */
        case ngx_http_fastcgi_st_data:
        case ngx_http_fastcgi_st_padding:
            break;
        }
    }

    f->state = state;

    return NGX_AGAIN;
}